

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

size_t absl::lts_20250127::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::Symbol>
                 (void *fn,void *slot)

{
  size_t sVar1;
  SymbolByFullNameHash *f;
  void *slot_local;
  void *fn_local;
  
  sVar1 = google::protobuf::(anonymous_namespace)::SymbolByFullNameHash::operator()
                    ((SymbolByFullNameHash *)fn,(Symbol *)slot);
  return sVar1;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}